

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab1-0.c
# Opt level: O0

int FeedFromArray(void)

{
  FILE *__stream;
  FILE *in;
  
  __stream = fopen("in.txt","w+");
  if (__stream == (FILE *)0x0) {
    printf("can\'t create in.txt. No space on disk?\n");
    in._4_4_ = -1;
  }
  else {
    fprintf(__stream,"%s",testInOut[testN].in);
    fclose(__stream);
    in._4_4_ = 0;
  }
  return in._4_4_;
}

Assistant:

static int FeedFromArray(void)
{
    FILE *const in = fopen("in.txt", "w+");
    if (!in) {
        printf("can't create in.txt. No space on disk?\n");
        return -1;
    }
    fprintf(in, "%s", testInOut[testN].in);
    fclose(in);
    return 0;
}